

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptConstantBufferType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  TTypeList *userDef;
  undefined4 extraout_var;
  char *syntax;
  pool_allocator<char> local_138;
  TString local_130;
  TQualifier postDeclQualifier;
  TType templateType;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokConstantBuffer);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      TType::TType(&templateType,EbtVoid,EvqTemporary,1,0,0,false);
      bVar1 = acceptType(this,&templateType);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          TQualifier::clear(&postDeclQualifier);
          postDeclQualifier._8_8_ = postDeclQualifier._8_8_ & 0xffffffffffffff80 | 5;
          bVar1 = (byte)templateType._8_1_ - 0xf < 2;
          if (bVar1) {
            userDef = TType::getWritableStruct(&templateType);
            local_138.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_130,"",&local_138);
            TType::TType(type,userDef,&local_130,&postDeclQualifier);
            iVar2 = (*type->_vptr_TType[10])(type);
            *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) =
                 *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) & 0xffffffffffffff80 | 5;
            return bVar1;
          }
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                    "non-structure type in ConstantBuffer","","");
          return bVar1;
        }
        syntax = "right angle bracket";
      }
      else {
        syntax = "type";
      }
    }
    else {
      syntax = "left angle bracket";
    }
    expected(this,syntax);
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptConstantBufferType(TType& type)
{
    if (! acceptTokenClass(EHTokConstantBuffer))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        expected("left angle bracket");
        return false;
    }
    
    TType templateType;
    if (! acceptType(templateType)) {
        expected("type");
        return false;
    }

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    TQualifier postDeclQualifier;
    postDeclQualifier.clear();
    postDeclQualifier.storage = EvqUniform;

    if (templateType.isStruct()) {
        // Make a block from the type parsed as the template argument
        TTypeList* typeList = templateType.getWritableStruct();
        new(&type) TType(typeList, "", postDeclQualifier); // sets EbtBlock

        type.getQualifier().storage = EvqUniform;

        return true;
    } else {
        parseContext.error(token.loc, "non-structure type in ConstantBuffer", "", "");
        return false;
    }
}